

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::Own<const_kj::ReadableFile>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryOpenFile(InMemoryDirectory *this,PathPtr path)

{
  Waiter *this_00;
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar5;
  long in_RCX;
  undefined8 *puVar6;
  ReadableDirectory *extraout_RDX;
  ReadableDirectory *extraout_RDX_01;
  char *pcVar7;
  ReadableDirectory *pRVar8;
  ReadableDirectory *extraout_RDX_02;
  ReadableDirectory *extraout_RDX_03;
  ReadableDirectory *extraout_RDX_04;
  ReadableDirectory *extraout_RDX_05;
  ReadableDirectory *extraout_RDX_06;
  _func_int **pp_Var9;
  Exception *pEVar10;
  Maybe<kj::Own<const_kj::ReadableDirectory>_> MVar11;
  Maybe<kj::Own<const_kj::ReadableFile>_> MVar12;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Fault f;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_68 [32];
  Maybe<kj::_::Mutex::Waiter_&> local_48;
  Impl *pIStack_40;
  ReadableDirectory *extraout_RDX_00;
  
  puVar6 = (undefined8 *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  if (in_RCX == 1) {
    this_00 = (Waiter *)(name_00.content.ptr + 1);
    _::Mutex::lock((Mutex *)this_00,SHARED);
    pIStack_40 = (Impl *)(name_00.content.ptr + 2);
    lVar2 = puVar6[1];
    if (lVar2 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*puVar6;
    }
    name.content.size_ = lVar2 + (ulong)(lVar2 == 0);
    name.content.ptr = pcVar7;
    local_48.ptr = this_00;
    MVar5 = Impl::tryGetEntry(pIStack_40,name);
    if (MVar5.ptr == (EntryImpl *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      pRVar8 = extraout_RDX_00;
    }
    else {
      uVar1 = ((MVar5.ptr)->node).tag;
      if (uVar1 == 3) {
        SymlinkNode::parse((Path *)local_68,(SymlinkNode *)&((MVar5.ptr)->node).field_1);
        _::Mutex::unlock((Mutex *)this_00,SHARED);
        local_48.ptr = (Waiter *)0x0;
        pIStack_40 = (Impl *)0x0;
        path_00.parts.size_ = local_68._0_8_;
        path_00.parts.ptr = name_00.content.ptr;
        MVar12 = tryOpenFile(this,path_00);
        uVar4 = local_68._8_8_;
        uVar3 = local_68._0_8_;
        pRVar8 = (ReadableDirectory *)MVar12.ptr.ptr;
        if ((Exception *)local_68._0_8_ != (Exception *)0x0) {
          local_68._0_8_ = (Exception *)0x0;
          local_68._8_8_ = (_func_int **)0x0;
          (***(_func_int ***)local_68._16_8_)
                    (local_68._16_8_,uVar3,0x18,uVar4,uVar4,
                     ArrayDisposer::Dispose_<kj::String,_false>::destruct);
          pRVar8 = extraout_RDX_03;
        }
      }
      else if (uVar1 == 1) {
        (**(code **)(**(long **)((long)&((MVar5.ptr)->node).field_1 + 8) + 0x28))(local_68);
        pp_Var9 = (_func_int **)local_68._8_8_;
        if ((_func_int **)local_68._8_8_ == (_func_int **)0x0) {
          pp_Var9 = (_func_int **)0x0;
          pEVar10 = (Exception *)0x0;
        }
        else {
          local_68._8_8_ = (_func_int **)0x0;
          pEVar10 = (Exception *)local_68._0_8_;
        }
        uVar3 = local_68._8_8_;
        pRVar8 = extraout_RDX_01;
        if ((_func_int **)local_68._8_8_ != (_func_int **)0x0) {
          local_68._8_8_ = (_func_int **)0x0;
          (**(code **)(((String *)local_68._0_8_)->content).ptr)
                    (local_68._0_8_,uVar3 + *(long *)(*(_func_int **)uVar3 + -0x10));
          pRVar8 = extraout_RDX_05;
        }
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)pEVar10;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var9;
      }
      else {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                  ((Fault *)local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x63f,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        _::Debug::Fault::~Fault((Fault *)local_68);
        pRVar8 = extraout_RDX_04;
      }
    }
    if (local_48.ptr != (Waiter *)0x0) {
      _::Mutex::unlock((Mutex *)local_48.ptr,SHARED);
      pRVar8 = extraout_RDX_06;
    }
  }
  else if (in_RCX == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              ((Fault *)local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x42f,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    _::Debug::Fault::~Fault((Fault *)local_68);
    pRVar8 = extraout_RDX;
  }
  else {
    if (puVar6[1] == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*puVar6;
    }
    name_00.content.size_ = (size_t)pcVar7;
    MVar11 = tryGetParent((InMemoryDirectory *)local_68,name_00);
    pRVar8 = MVar11.ptr.ptr;
    if ((_func_int **)local_68._8_8_ == (_func_int **)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(_func_int **)local_68._8_8_ + 0x50))
                (this,local_68._8_8_,puVar6 + 3,in_RCX + -1);
      (**(code **)(((String *)local_68._0_8_)->content).ptr)
                (local_68._0_8_,local_68._8_8_ + *(long *)(*(_func_int **)local_68._8_8_ + -0x10));
      pRVar8 = extraout_RDX_02;
    }
  }
  MVar12.ptr.ptr = (ReadableFile *)pRVar8;
  MVar12.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile>_>)MVar12.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a file") { return nullptr; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_MAYBE(entry, lock->tryGetEntry(path[0])) {
        return asFile(lock, *entry);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(subdir, tryGetParent(path[0])) {
        return subdir->get()->tryOpenFile(path.slice(1, path.size()));
      } else {
        return nullptr;
      }
    }
  }